

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long __thiscall mkvparser::Segment::DoLoadClusterUnknownSize(Segment *this,longlong *pos,long *len)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  
  lVar1 = -1;
  if (-1 < this->m_pos) {
    return lVar1;
  }
  if (this->m_pUnknownSize != (Cluster *)0x0) {
    lVar1 = Cluster::Parse(this->m_pUnknownSize,pos,len);
    bVar3 = lVar1 != 0;
    if ((-1 < lVar1) && (lVar1 = 2, bVar3)) {
      lVar2 = this->m_pUnknownSize->m_element_size;
      if (lVar2 < 0) {
        lVar1 = -2;
      }
      else {
        lVar2 = lVar2 + this->m_pUnknownSize->m_element_start;
        *pos = lVar2;
        this->m_pos = lVar2;
        this->m_pUnknownSize = (Cluster *)0x0;
      }
    }
  }
  return lVar1;
}

Assistant:

long Segment::DoLoadClusterUnknownSize(long long& pos, long& len) {
  if (m_pos >= 0 || m_pUnknownSize == NULL)
    return E_PARSE_FAILED;

  const long status = m_pUnknownSize->Parse(pos, len);

  if (status < 0)  // error or underflow
    return status;

  if (status == 0)  // parsed a block
    return 2;  // continue parsing

  const long long start = m_pUnknownSize->m_element_start;
  const long long size = m_pUnknownSize->GetElementSize();

  if (size < 0)
    return E_FILE_FORMAT_INVALID;

  pos = start + size;
  m_pos = pos;

  m_pUnknownSize = 0;

  return 2;  // continue parsing
}